

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O1

bool boost::ext::ut::v1_1_8::utility::is_match(string_view input,string_view pattern)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  string_view input_00;
  string_view input_01;
  string_view pattern_00;
  string_view pattern_01;
  char *local_38;
  char *pcVar4;
  
  pcVar3 = pattern._M_str;
  sVar8 = pattern._M_len;
  local_38 = input._M_str;
  uVar10 = input._M_len;
  uVar6 = uVar10;
  do {
    uVar6 = uVar6 - 1;
    lVar7 = -sVar8;
    pcVar4 = pcVar3;
    while( true ) {
      lVar7 = lVar7 + 1;
      pcVar3 = pcVar4 + 1;
      if (lVar7 == 1) {
        return uVar10 == 0;
      }
      cVar1 = *pcVar4;
      if (uVar10 != 0) break;
      pcVar4 = pcVar3;
      if (cVar1 != '*') {
        return false;
      }
    }
    if (cVar1 != '?') {
      if (cVar1 == '*') {
LAB_0010d2cd:
        input_00._M_str = local_38;
        input_00._M_len = uVar10;
        pattern_00._M_str = pcVar3;
        pattern_00._M_len = -lVar7;
        bVar2 = is_match(input_00,pattern_00);
        bVar5 = true;
        if (!bVar2) {
          uVar9 = 1;
          do {
            bVar5 = uVar9 <= uVar10;
            if (uVar10 < uVar9) {
              return bVar5;
            }
            input_01._M_str = local_38 + uVar9;
            input_01._M_len = uVar6;
            pattern_01._M_str = pcVar3;
            pattern_01._M_len = -lVar7;
            bVar2 = is_match(input_01,pattern_01);
            uVar9 = uVar9 + 1;
            uVar6 = uVar6 - 1;
          } while (!bVar2);
        }
        return bVar5;
      }
      if (cVar1 != *local_38) {
        return false;
      }
      if (cVar1 == '*') goto LAB_0010d2cd;
    }
    local_38 = local_38 + 1;
    uVar10 = uVar10 - 1;
    sVar8 = -lVar7;
  } while( true );
}

Assistant:

[[nodiscard]] inline auto is_match(std::string_view input,
                                     std::string_view pattern) -> bool {
    if (std::empty(pattern)) {
      return std::empty(input);
    }

    if (std::empty(input)) {
      return pattern[0] == '*' ? is_match(input, pattern.substr(1)) : false;
    }

    if (pattern[0] != '?' and pattern[0] != '*' and pattern[0] != input[0]) {
      return false;
    }

    if (pattern[0] == '*') {
      for (decltype(std::size(input)) i = 0u; i <= std::size(input); ++i) {
        if (is_match(input.substr(i), pattern.substr(1))) {
          return true;
        }
      }
      return false;
    }

    return is_match(input.substr(1), pattern.substr(1));
  }